

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printVectorListThreeAllLanes(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_struct *pcVar2;
  cs_detail *pcVar3;
  uint uVar4;
  MCOperand *pMVar5;
  SStream *O_local;
  uint OpNum_local;
  MCInst *MI_local;
  
  SStream_concat0(O,"{");
  pcVar2 = MI->csh;
  pMVar5 = MCInst_getOperand(MI,OpNum);
  uVar4 = MCOperand_getReg(pMVar5);
  printRegName(pcVar2,O,uVar4);
  if (MI->csh->detail != CS_OPT_OFF) {
    puVar1 = MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x42;
    puVar1[0] = '\x01';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pMVar5 = MCInst_getOperand(MI,OpNum);
    uVar4 = MCOperand_getReg(pMVar5);
    *(uint *)(MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x46) = uVar4;
    pcVar3 = MI->flat_insn->detail;
    (pcVar3->field_6).arm.op_count = (pcVar3->field_6).arm.op_count + '\x01';
  }
  SStream_concat0(O,"[], ");
  pcVar2 = MI->csh;
  pMVar5 = MCInst_getOperand(MI,OpNum);
  uVar4 = MCOperand_getReg(pMVar5);
  printRegName(pcVar2,O,uVar4 + 1);
  if (MI->csh->detail != CS_OPT_OFF) {
    puVar1 = MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x42;
    puVar1[0] = '\x01';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pMVar5 = MCInst_getOperand(MI,OpNum);
    uVar4 = MCOperand_getReg(pMVar5);
    *(uint *)(MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x46) = uVar4 + 1;
    pcVar3 = MI->flat_insn->detail;
    (pcVar3->field_6).arm.op_count = (pcVar3->field_6).arm.op_count + '\x01';
  }
  SStream_concat0(O,"[], ");
  pcVar2 = MI->csh;
  pMVar5 = MCInst_getOperand(MI,OpNum);
  uVar4 = MCOperand_getReg(pMVar5);
  printRegName(pcVar2,O,uVar4 + 2);
  if (MI->csh->detail != CS_OPT_OFF) {
    puVar1 = MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x42;
    puVar1[0] = '\x01';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pMVar5 = MCInst_getOperand(MI,OpNum);
    uVar4 = MCOperand_getReg(pMVar5);
    *(uint *)(MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x46) = uVar4 + 2;
    pcVar3 = MI->flat_insn->detail;
    (pcVar3->field_6).arm.op_count = (pcVar3->field_6).arm.op_count + '\x01';
  }
  SStream_concat0(O,"[]}");
  return;
}

Assistant:

static void printVectorListThreeAllLanes(MCInst *MI, unsigned OpNum, SStream *O)
{
	// Normally, it's not safe to use register enum values directly with
	// addition to get the next register, but for VFP registers, the
	// sort order is guaranteed because they're all of the form D<n>.
	SStream_concat0(O, "{");
	printRegName(MI->csh, O, MCOperand_getReg(MCInst_getOperand(MI, OpNum)));
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MCInst_getOperand(MI, OpNum));
		MI->flat_insn->detail->arm.op_count++;
	}
	SStream_concat0(O, "[], ");
	printRegName(MI->csh, O, MCOperand_getReg(MCInst_getOperand(MI, OpNum)) + 1);
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MCInst_getOperand(MI, OpNum)) + 1;
		MI->flat_insn->detail->arm.op_count++;
	}
	SStream_concat0(O, "[], ");
	printRegName(MI->csh, O, MCOperand_getReg(MCInst_getOperand(MI, OpNum)) + 2);
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MCInst_getOperand(MI, OpNum)) + 2;
		MI->flat_insn->detail->arm.op_count++;
	}
	SStream_concat0(O, "[]}");
}